

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall cmCTestTestCommand::InitializeHandler(cmCTestTestCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  cmValue cVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  cmDuration t;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  ostringstream cmCTestLog_msg;
  unsigned_long testLoad;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  size_type local_220;
  pointer local_218;
  undefined8 local_210;
  char *local_208;
  size_type local_200;
  pointer local_1f8;
  ios_base local_1d0 [264];
  char *local_c8;
  char *local_c0;
  char local_b8;
  undefined7 uStack_b7;
  string local_98;
  string local_78;
  unsigned_long local_58;
  undefined1 *local_50;
  undefined1 local_48 [32];
  cmCTestTestHandler *this_00;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_240._0_8_ = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"CTEST_TEST_TIMEOUT","");
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
  }
  if (cVar5.Value == (string *)0x0) {
    t = cmCTest::GetTimeOut((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    if (t.__r <= 0.0) {
      t.__r = 600.0;
    }
  }
  else {
    t.__r = atof(((cVar5.Value)->_M_dataplus)._M_p);
  }
  cmCTest::SetTimeOut((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,t);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_240._0_8_ = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"CTEST_RESOURCE_SPEC_FILE","")
  ;
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
  }
  if (cVar5.Value != (string *)0x0 && (this->ResourceSpecFile)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
  }
  iVar4 = (*(this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand
            [9])(this);
  this_00 = (cmCTestTestHandler *)CONCAT44(extraout_var,iVar4);
  if ((((this->Start)._M_string_length != 0) || ((this->End)._M_string_length != 0)) ||
     ((this->Stride)._M_string_length != 0)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"TestsToRunInformation","");
    local_240._8_8_ = (this->Start)._M_dataplus._M_p;
    local_240._0_8_ = (this->Start)._M_string_length;
    local_230._8_8_ = local_48;
    local_58 = 1;
    local_48[0] = 0x2c;
    local_230._M_allocated_capacity = 1;
    local_218 = (this->End)._M_dataplus._M_p;
    local_220 = (this->End)._M_string_length;
    local_208 = &local_b8;
    local_c8 = (char *)0x1;
    local_b8 = ',';
    local_210 = 1;
    local_1f8 = (this->Stride)._M_dataplus._M_p;
    local_200 = (this->Stride)._M_string_length;
    views._M_len = 5;
    views._M_array = (iterator)local_240;
    local_c0 = local_208;
    local_50 = (undefined1 *)local_230._8_8_;
    cmCatViews_abi_cxx11_(&local_78,views);
    cmCTestGenericHandler::SetOption((cmCTestGenericHandler *)this_00,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->Exclude)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"ExcludeRegularExpression","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,(cmValue)&this->Exclude);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->Include)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"IncludeRegularExpression","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,(cmValue)&this->Include);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->ExcludeLabel)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"ExcludeLabelRegularExpression","");
    cmCTestGenericHandler::AddMultiOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,&this->ExcludeLabel);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->IncludeLabel)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"LabelRegularExpression","")
    ;
    cmCTestGenericHandler::AddMultiOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,&this->IncludeLabel);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->ExcludeFixture)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"ExcludeFixtureRegularExpression","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,(cmValue)&this->ExcludeFixture);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->ExcludeFixtureSetup)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"ExcludeFixtureSetupRegularExpression","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,
               (cmValue)&this->ExcludeFixtureSetup);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->ExcludeFixtureCleanup)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"ExcludeFixtureCleanupRegularExpression","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,
               (cmValue)&this->ExcludeFixtureCleanup);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if (this->StopOnFailure == true) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"StopOnFailure","");
    cmCTestGenericHandler::SetOption((cmCTestGenericHandler *)this_00,(string *)local_240,"ON");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->ParallelLevel)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"ParallelLevel","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,(cmValue)&this->ParallelLevel);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->Repeat)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"Repeat","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,(cmValue)&this->Repeat);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->ScheduleRandom)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"ScheduleRandom","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,(cmValue)&this->ScheduleRandom);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->ResourceSpecFile)._M_string_length != 0) {
    local_240._0_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"ResourceSpecFile","");
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)local_240,(cmValue)&this->ResourceSpecFile
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
  }
  if ((this->StopTime)._M_string_length != 0) {
    cmCTest::SetStopTime
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,&this->StopTime);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_240._0_8_ = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"CTEST_TEST_LOAD","");
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
  }
  if ((this->TestLoad)._M_string_length == 0) {
    if ((cVar5.Value == (string *)0x0) || ((cVar5.Value)->_M_string_length == 0)) {
      local_58 = cmCTest::GetTestLoad
                           ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
      goto LAB_001c9a1f;
    }
    bVar3 = cmStrToULong(cVar5.Value,&local_58);
    if (bVar3) goto LAB_001c9a1f;
    local_58 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,"Invalid value for \'CTEST_TEST_LOAD\' : ",0x26);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_240,((cVar5.Value)->_M_dataplus)._M_p,
                        (cVar5.Value)->_M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                 ,0x82,local_c8,false);
  }
  else {
    bVar3 = cmStrToULong(&this->TestLoad,&local_58);
    if (bVar3) goto LAB_001c9a1f;
    local_58 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,"Invalid value for \'TEST_LOAD\' : ",0x20);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_240,(this->TestLoad)._M_dataplus._M_p,
                        (this->TestLoad)._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                 ,0x7b,local_c8,false);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
  std::ios_base::~ios_base(local_1d0);
LAB_001c9a1f:
  (this_00->super_cmCTestGenericHandler).TestLoad = local_58;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_240._0_8_ = &local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_240,"CTEST_LABELS_FOR_SUBPROJECTS","");
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
  }
  if (cVar5.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,cVar5.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  if ((this->OutputJUnit)._M_string_length != 0) {
    cmCTestTestHandler::SetJUnitXMLFileName(this_00,&this->OutputJUnit);
  }
  (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestTestCommand::InitializeHandler()
{
  cmValue ctestTimeout = this->Makefile->GetDefinition("CTEST_TEST_TIMEOUT");

  cmDuration timeout;
  if (ctestTimeout) {
    timeout = cmDuration(atof(ctestTimeout->c_str()));
  } else {
    timeout = this->CTest->GetTimeOut();
    if (timeout <= cmDuration::zero()) {
      // By default use timeout of 10 minutes
      timeout = std::chrono::minutes(10);
    }
  }
  this->CTest->SetTimeOut(timeout);

  cmValue resourceSpecFile =
    this->Makefile->GetDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (this->ResourceSpecFile.empty() && resourceSpecFile) {
    this->ResourceSpecFile = *resourceSpecFile;
  }

  cmCTestTestHandler* handler = this->InitializeActualHandler();
  if (!this->Start.empty() || !this->End.empty() || !this->Stride.empty()) {
    handler->SetOption(
      "TestsToRunInformation",
      cmStrCat(this->Start, ',', this->End, ',', this->Stride));
  }
  if (!this->Exclude.empty()) {
    handler->SetOption("ExcludeRegularExpression", this->Exclude);
  }
  if (!this->Include.empty()) {
    handler->SetOption("IncludeRegularExpression", this->Include);
  }
  if (!this->ExcludeLabel.empty()) {
    handler->AddMultiOption("ExcludeLabelRegularExpression",
                            this->ExcludeLabel);
  }
  if (!this->IncludeLabel.empty()) {
    handler->AddMultiOption("LabelRegularExpression", this->IncludeLabel);
  }
  if (!this->ExcludeFixture.empty()) {
    handler->SetOption("ExcludeFixtureRegularExpression",
                       this->ExcludeFixture);
  }
  if (!this->ExcludeFixtureSetup.empty()) {
    handler->SetOption("ExcludeFixtureSetupRegularExpression",
                       this->ExcludeFixtureSetup);
  }
  if (!this->ExcludeFixtureCleanup.empty()) {
    handler->SetOption("ExcludeFixtureCleanupRegularExpression",
                       this->ExcludeFixtureCleanup);
  }
  if (this->StopOnFailure) {
    handler->SetOption("StopOnFailure", "ON");
  }
  if (!this->ParallelLevel.empty()) {
    handler->SetOption("ParallelLevel", this->ParallelLevel);
  }
  if (!this->Repeat.empty()) {
    handler->SetOption("Repeat", this->Repeat);
  }
  if (!this->ScheduleRandom.empty()) {
    handler->SetOption("ScheduleRandom", this->ScheduleRandom);
  }
  if (!this->ResourceSpecFile.empty()) {
    handler->SetOption("ResourceSpecFile", this->ResourceSpecFile);
  }
  if (!this->StopTime.empty()) {
    this->CTest->SetStopTime(this->StopTime);
  }

  // Test load is determined by: TEST_LOAD argument,
  // or CTEST_TEST_LOAD script variable, or ctest --test-load
  // command line argument... in that order.
  unsigned long testLoad;
  cmValue ctestTestLoad = this->Makefile->GetDefinition("CTEST_TEST_LOAD");
  if (!this->TestLoad.empty()) {
    if (!cmStrToULong(this->TestLoad, &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'TEST_LOAD' : " << this->TestLoad
                                                    << std::endl);
    }
  } else if (cmNonempty(ctestTestLoad)) {
    if (!cmStrToULong(*ctestTestLoad, &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'CTEST_TEST_LOAD' : " << *ctestTestLoad
                                                          << std::endl);
    }
  } else {
    testLoad = this->CTest->GetTestLoad();
  }
  handler->SetTestLoad(testLoad);

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  if (!this->OutputJUnit.empty()) {
    handler->SetJUnitXMLFileName(this->OutputJUnit);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}